

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_persistence_representations.h
# Opt level: O2

double Gudhi::Persistence_representations::find_zero_of_a_line_segment_between_those_two_points
                 (pair<double,_double> p1,pair<double,_double> p2)

{
  ostream *poVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  string errMessageStr;
  ostringstream errMessage;
  
  dVar5 = p2.second;
  dVar6 = p2.first;
  dVar3 = p1.second;
  dVar4 = p1.first;
  if ((dVar4 != dVar6) || (NAN(dVar4) || NAN(dVar6))) {
    if (0.0 < dVar3 * dVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errMessage);
      std::operator<<((ostream *)&errMessage,
                      "In function find_zero_of_a_line_segment_between_those_two_points the arguments are: ("
                     );
      poVar1 = std::ostream::_M_insert<double>(dVar4);
      std::operator<<(poVar1,",");
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::operator<<(poVar1,") and (");
      poVar1 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar1,",");
      poVar1 = std::ostream::_M_insert<double>(dVar5);
      std::operator<<(poVar1,
                      "). There is no zero in line between those two points. Program terminated.");
      std::__cxx11::stringbuf::str();
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = errMessageStr._M_dataplus._M_p;
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
    dVar6 = (dVar5 - dVar3) / (dVar6 - dVar4);
    dVar4 = -(dVar3 - dVar4 * dVar6) / dVar6;
  }
  return dVar4;
}

Assistant:

double find_zero_of_a_line_segment_between_those_two_points(std::pair<double, double> p1,
                                                            std::pair<double, double> p2) {
  if (p1.first == p2.first) return p1.first;
  if (p1.second * p2.second > 0) {
    std::ostringstream errMessage;
    errMessage << "In function find_zero_of_a_line_segment_between_those_two_points the arguments are: (" << p1.first
               << "," << p1.second << ") and (" << p2.first << "," << p2.second
               << "). There is no zero in line between those two points. Program terminated.";
    std::string errMessageStr = errMessage.str();
    const char* err = errMessageStr.c_str();
    throw(err);
  }
  // we assume here, that x \in [ p1.first, p2.first ] and p1 and p2 are points between which we will put the line
  // segment
  double a = (p2.second - p1.second) / (p2.first - p1.first);
  double b = p1.second - a * p1.first;
  return -b / a;
}